

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O2

void __thiscall juzzlin::SimpleLogger::Impl::prefixWithLevelAndTag(Impl *this,Level level)

{
  size_type sVar1;
  mapped_type *pmVar2;
  ostream *poVar3;
  Level local_64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_64 = level;
  pmVar2 = std::
           map<juzzlin::SimpleLogger::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<juzzlin::SimpleLogger::Level>,_std::allocator<std::pair<const_juzzlin::SimpleLogger::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<juzzlin::SimpleLogger::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<juzzlin::SimpleLogger::Level>,_std::allocator<std::pair<const_juzzlin::SimpleLogger::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)m_symbols_abi_cxx11_,&local_64);
  poVar3 = std::operator<<((ostream *)&this->m_message,(string *)pmVar2);
  sVar1 = (this->m_tag)._M_string_length;
  if (sVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"",(allocator<char> *)&local_40);
  }
  else {
    std::operator+(&local_40," ",&this->m_tag);
    std::operator+(&local_60,&local_40,":");
  }
  poVar3 = std::operator<<(poVar3,(string *)&local_60);
  std::operator<<(poVar3," ");
  std::__cxx11::string::~string((string *)&local_60);
  if (sVar1 != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void SimpleLogger::Impl::prefixWithLevelAndTag(SimpleLogger::Level level)
{
    m_message << m_symbols[level] << (!m_tag.empty() ? " " + m_tag + ":" : "") << " ";
}